

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

String * __thiscall
asl::SocketServer::socketError(String *__return_storage_ptr__,SocketServer *this)

{
  int n;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  
  n = (this->_socketError)._len;
  String::alloc(__return_storage_ptr__,n);
  __return_storage_ptr__->_len = n;
  if (__return_storage_ptr__->_size == 0) {
    __dest = &__return_storage_ptr__->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  if ((this->_socketError)._size == 0) {
    __src = &(this->_socketError).field_2;
  }
  else {
    __src = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_socketError).field_2._str;
  }
  memcpy(__dest,__src,(long)n + 1);
  return __return_storage_ptr__;
}

Assistant:

String SocketServer::socketError() const
{
	return _socketError;
}